

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::InitGoogleTestImpl<char>(int *argc,char **argv)

{
  UnitTestImpl *this;
  String *rhs;
  value_type local_48;
  int local_38;
  int i;
  String local_28;
  char **local_18;
  char **argv_local;
  int *argc_local;
  
  g_init_gtest_count = g_init_gtest_count + 1;
  if ((g_init_gtest_count == 1) && (0 < *argc)) {
    rhs = &local_28;
    local_18 = argv;
    argv_local = (char **)argc;
    StreamableToString<char*>((internal *)rhs,argv);
    String::operator=((String *)g_executable_path,rhs);
    String::~String(rhs);
    std::vector<testing::internal::String,_std::allocator<testing::internal::String>_>::clear
              ((vector<testing::internal::String,_std::allocator<testing::internal::String>_> *)
               g_argvs);
    for (local_38 = 0; local_38 != *(int *)argv_local; local_38 = local_38 + 1) {
      StreamableToString<char*>((internal *)&local_48,local_18 + local_38);
      std::vector<testing::internal::String,_std::allocator<testing::internal::String>_>::push_back
                ((vector<testing::internal::String,_std::allocator<testing::internal::String>_> *)
                 g_argvs,&local_48);
      String::~String(rhs);
    }
    ParseGoogleTestFlagsOnly((int *)argv_local,local_18);
    this = GetUnitTestImpl();
    UnitTestImpl::PostFlagParsingInit(this);
  }
  return;
}

Assistant:

void InitGoogleTestImpl(int* argc, CharType** argv) {
  g_init_gtest_count++;

  // We don't want to run the initialization code twice.
  if (g_init_gtest_count != 1) return;

  if (*argc <= 0) return;

  internal::g_executable_path = internal::StreamableToString(argv[0]);

#if GTEST_HAS_DEATH_TEST

  g_argvs.clear();
  for (int i = 0; i != *argc; i++) {
    g_argvs.push_back(StreamableToString(argv[i]));
  }

#endif  // GTEST_HAS_DEATH_TEST

  ParseGoogleTestFlagsOnly(argc, argv);
  GetUnitTestImpl()->PostFlagParsingInit();
}